

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_exits(CHAR_DATA *ch,char *argument)

{
  EXIT_DATA *pEVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  int door;
  long lVar9;
  char buf [4608];
  char local_1238 [4616];
  
  bVar2 = check_blind(ch);
  if (bVar2) {
    bVar2 = is_affected_room(ch->in_room,(int)gsn_smokescreen);
    if (bVar2) {
      pcVar5 = get_char_color(ch,"darkgrey");
      pcVar6 = END_COLOR(ch);
      sprintf(local_1238,"%sDense smoke prevents any vision beyond this room!%s\n\r",pcVar5,pcVar6);
      send_to_char(local_1238,ch);
    }
    bVar2 = str_cmp(argument,"auto");
    if (bVar2) {
      bVar3 = is_immortal(ch);
      if (bVar3) {
        sprintf(local_1238,"Obvious exits from room %d:\n\r",(ulong)(uint)(int)ch->in_room->vnum);
      }
      else {
        builtin_strncpy(local_1238,"Obvious exits:\n\r",0x11);
      }
    }
    else {
      builtin_strncpy(local_1238,"[Exits:",8);
    }
    bVar3 = false;
    for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
      pEVar1 = ch->in_room->exit[lVar9];
      if ((pEVar1 != (EXIT_DATA *)0x0) && ((pEVar1->u1).to_room != (ROOM_INDEX_DATA *)0x0)) {
        bVar4 = can_see_room(ch,(pEVar1->u1).to_room);
        if (bVar4) {
          if ((pEVar1->exit_info[0] & 0x100) != 0) {
            bVar4 = is_immortal(ch);
            if (!bVar4) goto LAB_002a9e50;
          }
          bVar4 = is_affected_room(ch->in_room,(int)gsn_smokescreen);
          if (!bVar4) {
            if (bVar2) {
              sVar7 = strlen(local_1238);
              pcVar5 = capitalize(dir_name[lVar9]);
              bVar3 = room_is_dark((pEVar1->u1).to_room);
              pcVar6 = "Too dark to tell";
              if (!bVar3) {
                pcVar6 = get_room_name((pEVar1->u1).to_room);
              }
              sprintf(local_1238 + sVar7,"%-5s - %s",pcVar5,pcVar6);
              bVar3 = is_immortal(ch);
              sVar7 = strlen(local_1238);
              pcVar5 = local_1238 + sVar7;
              if (bVar3) {
                pcVar6 = "(CLOSED) ";
                if ((pEVar1->exit_info[0] & 2U) == 0) {
                  pcVar6 = "";
                }
                pcVar8 = "(NONOBVIOUS) ";
                if (((uint)pEVar1->exit_info[0] >> 8 & 1) == 0) {
                  pcVar8 = "";
                }
                sprintf(pcVar5," %s%s(room %d)\n\r",pcVar6,pcVar8,
                        (ulong)(uint)(int)((pEVar1->u1).to_room)->vnum);
              }
              else {
                local_1238[sVar7 + 2] = '\0';
                pcVar5[0] = '\n';
                pcVar5[1] = '\r';
              }
              bVar3 = true;
            }
            else {
              sVar7 = strlen(local_1238);
              (local_1238 + sVar7)[0] = ' ';
              (local_1238 + sVar7)[1] = '\0';
              if ((pEVar1->exit_info[0] & 0x102) != 0) {
                sVar7 = strlen(local_1238);
                (local_1238 + sVar7)[0] = '(';
                (local_1238 + sVar7)[1] = '\0';
              }
              strcat(local_1238,dir_name[lVar9]);
              bVar3 = true;
              if ((pEVar1->exit_info[0] & 0x102) != 0) {
                sVar7 = strlen(local_1238);
                (local_1238 + sVar7)[0] = ')';
                (local_1238 + sVar7)[1] = '\0';
              }
            }
          }
        }
      }
LAB_002a9e50:
    }
    if (!bVar3) {
      pcVar5 = " none";
      if (bVar2) {
        pcVar5 = "None.\n\r";
      }
      strcat(local_1238,pcVar5);
    }
    if (!bVar2) {
      sVar7 = strlen(local_1238);
      builtin_strncpy(local_1238 + sVar7,"]\n\r",4);
    }
    send_to_char(local_1238,ch);
  }
  return;
}

Assistant:

void do_exits(CHAR_DATA *ch, char *argument)
{
	if (!check_blind(ch))
		return;

	char buf[MAX_STRING_LENGTH];
	if (is_affected_room(ch->in_room, gsn_smokescreen))
	{
		sprintf(buf, "%sDense smoke prevents any vision beyond this room!%s\n\r",
			get_char_color(ch, "darkgrey"),
			END_COLOR(ch));

		send_to_char(buf, ch);
	}

	auto fAuto = !str_cmp(argument, "auto");
	if (fAuto)
		sprintf(buf, "[Exits:");
	else if (is_immortal(ch))
		sprintf(buf, "Obvious exits from room %d:\n\r", ch->in_room->vnum);
	else
		sprintf(buf, "Obvious exits:\n\r");

	auto found = false;
	for (auto door = 0; door <= 5; door++)
	{
		auto pexit = ch->in_room->exit[door];

		if (pexit != nullptr
			&& pexit->u1.to_room != nullptr
			&& can_see_room(ch, pexit->u1.to_room)
			&& (!IS_SET(pexit->exit_info, EX_NONOBVIOUS) || is_immortal(ch))
			&& !is_affected_room(ch->in_room, gsn_smokescreen))
		{
			found = true;

			if (fAuto)
			{
				strcat(buf, " ");
				if (IS_SET(pexit->exit_info, EX_CLOSED) || IS_SET(pexit->exit_info, EX_NONOBVIOUS))
					strcat(buf, "(");

				strcat(buf, dir_name[door]);
				if (IS_SET(pexit->exit_info, EX_CLOSED) || IS_SET(pexit->exit_info, EX_NONOBVIOUS))
					strcat(buf, ")");
			}
			else
			{
				sprintf(buf + strlen(buf), "%-5s - %s",
					capitalize(dir_name[door]),
					room_is_dark(pexit->u1.to_room) ? "Too dark to tell" : get_room_name(pexit->u1.to_room));

				if (is_immortal(ch))
					sprintf(buf + strlen(buf), " %s%s(room %d)\n\r",
						IS_SET(pexit->exit_info, EX_CLOSED) ? "(CLOSED) " : "",
						IS_SET(pexit->exit_info, EX_NONOBVIOUS) ? "(NONOBVIOUS) " : "", pexit->u1.to_room->vnum);
				else
					sprintf(buf + strlen(buf), "\n\r");
			}
		}
	}

	if (!found)
		strcat(buf, fAuto ? " none" : "None.\n\r");

	if (fAuto)
		strcat(buf, "]\n\r");

	send_to_char(buf, ch);
}